

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SSBOArrayLengthTests::init(SSBOArrayLengthTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  SSBOArrayLengthCase *this_00;
  char *desc_00;
  SSBOArrayLengthTests *pSVar1;
  char *pcVar2;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string name;
  int qualifierNdx;
  int sizeNdx;
  SSBOArrayLengthTests *this_local;
  
  name.field_2._12_4_ = 0;
  pSVar1 = this;
  while ((int)name.field_2._12_4_ < 2) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 3;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)&local_98);
      pcVar2 = "unsized_";
      if ((init::arraysSized[(int)name.field_2._12_4_] & 1U) != 0) {
        pcVar2 = "sized_";
      }
      std::operator+(&local_78,&local_98,pcVar2);
      std::operator+(&local_58,&local_78,init::qualifiers[(int)name.field_2._8_4_].name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     &local_58,"array");
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"Test length() of ",&local_129);
      pcVar2 = "unsized ";
      if ((init::arraysSized[(int)name.field_2._12_4_] & 1U) != 0) {
        pcVar2 = "sized ";
      }
      std::operator+(&local_108,&local_128,pcVar2);
      std::operator+(&local_e8,&local_108,init::qualifiers[(int)name.field_2._8_4_].name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_e8," array");
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      this_00 = (SSBOArrayLengthCase *)operator_new(0x90);
      context = (this->super_TestCaseGroup).m_context;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      desc_00 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::SSBOArrayLengthCase::SSBOArrayLengthCase
                (this_00,context,pcVar2,desc_00,init::qualifiers[(int)name.field_2._8_4_].access,
                 (bool)(init::arraysSized[(int)name.field_2._12_4_] & 1));
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)local_38);
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
    pSVar1 = (SSBOArrayLengthTests *)(ulong)(uint)name.field_2._12_4_;
  }
  return (int)pSVar1;
}

Assistant:

void SSBOArrayLengthTests::init (void)
{
	static const struct Qualifier
	{
		SSBOArrayLengthCase::ArrayAccess	access;
		const char*							name;
		const char*							desc;
	}  qualifiers[] =
	{
		{ SSBOArrayLengthCase::ACCESS_DEFAULT,		"",				""			},
		{ SSBOArrayLengthCase::ACCESS_WRITEONLY,	"writeonly_",	"writeonly"	},
		{ SSBOArrayLengthCase::ACCESS_READONLY,		"readonly_",	"readonly"	},
	};

	static const bool arraysSized[]	= { true, false };

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(arraysSized); ++sizeNdx)
	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		const std::string name = std::string() + ((arraysSized[sizeNdx]) ? ("sized_") : ("unsized_")) + qualifiers[qualifierNdx].name + "array";
		const std::string desc = std::string("Test length() of ") + ((arraysSized[sizeNdx]) ? ("sized ") : ("unsized ")) + qualifiers[qualifierNdx].name + " array";

		this->addChild(new SSBOArrayLengthCase(m_context, name.c_str(), desc.c_str(), qualifiers[qualifierNdx].access, arraysSized[sizeNdx]));
	}
}